

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

void __thiscall CTcSymObjBase::inherit_vocab(CTcSymObjBase *this)

{
  CTcObjScEntry *pCVar1;
  
  if ((*(uint *)&this->field_0xb8 >> 8 & 1) == 0) {
    *(ushort *)&this->field_0xb8 = (ushort)*(uint *)&this->field_0xb8 | 0x100;
    for (pCVar1 = this->sc_; pCVar1 != (CTcObjScEntry *)0x0;
        pCVar1 = *(CTcObjScEntry **)(pCVar1 + 8)) {
      inherit_vocab(*(CTcSymObjBase **)pCVar1);
      add_vocab_to_subclass(*(CTcSymObjBase **)pCVar1,(CTcSymObj *)this);
    }
  }
  return;
}

Assistant:

void CTcSymObjBase::inherit_vocab()
{
    /* 
     *   if I've already inherited my superclass vocabulary, there's
     *   nothing more we need to do 
     */
    if (vocab_inherited_)
        return;

    /* make a note that I've inherited my superclass vocabulary */
    vocab_inherited_ = TRUE;

    /* inherit words from each superclass */
    for (CTcObjScEntry *sc = sc_ ; sc != 0 ; sc = sc->nxt_)
    {
        /* make sure this superclass has built its inherited list */
        sc->sym_->inherit_vocab();
        
        /* add this superclass's words to my list */
        sc->sym_->add_vocab_to_subclass((CTcSymObj *)this);
    }
}